

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void gmath::Distortion::cleanAllProperties(Properties *prop,int id)

{
  RadialDistortion rd;
  RadialTangentialDistortion rtd;
  EquidistantDistortion ed;
  Properties *in_stack_000000a8;
  RadialDistortion *in_stack_000000b0;
  int in_stack_00000104;
  Properties *in_stack_00000108;
  EquidistantDistortion *in_stack_00000110;
  int in_stack_00000174;
  Properties *in_stack_00000178;
  RadialTangentialDistortion *in_stack_00000180;
  EquidistantDistortion *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff7c;
  RadialTangentialDistortion *in_stack_ffffffffffffff80;
  
  EquidistantDistortion::EquidistantDistortion(in_stack_ffffffffffffff60);
  RadialTangentialDistortion::RadialTangentialDistortion
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  RadialDistortion::RadialDistortion
            ((RadialDistortion *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  EquidistantDistortion::cleanProperties(in_stack_00000110,in_stack_00000108,in_stack_00000104);
  RadialTangentialDistortion::cleanProperties(in_stack_00000180,in_stack_00000178,in_stack_00000174)
  ;
  RadialDistortion::cleanProperties(in_stack_000000b0,in_stack_000000a8,prop._4_4_);
  RadialDistortion::~RadialDistortion((RadialDistortion *)0x1ca6b7);
  RadialTangentialDistortion::~RadialTangentialDistortion((RadialTangentialDistortion *)0x1ca6c1);
  EquidistantDistortion::~EquidistantDistortion((EquidistantDistortion *)0x1ca6cb);
  return;
}

Assistant:

void Distortion::cleanAllProperties(gutil::Properties &prop, int id)
{
  EquidistantDistortion ed;
  RadialTangentialDistortion rtd(3);
  RadialDistortion rd(3);

  ed.cleanProperties(prop, id);
  rtd.cleanProperties(prop, id);
  rd.cleanProperties(prop, id);
}